

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

void D_PostEvent(event_t *ev)

{
  event_t *peVar1;
  BYTE BVar2;
  SWORD SVar3;
  SWORD SVar4;
  SWORD SVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  
  iVar9 = eventhead;
  lVar8 = (long)eventhead;
  if ((ev->type != '\x05') || (events[lVar8].type != '\x05')) {
    BVar2 = ev->subtype;
    SVar3 = ev->data1;
    SVar4 = ev->data2;
    SVar5 = ev->data3;
    iVar7 = ev->x;
    iVar6 = ev->y;
    peVar1 = events + lVar8;
    peVar1->type = ev->type;
    peVar1->subtype = BVar2;
    peVar1->data1 = SVar3;
    peVar1->data2 = SVar4;
    peVar1->data3 = SVar5;
    events[lVar8].x = iVar7;
    events[lVar8].y = iVar6;
    if ((ev->type == '\x03') &&
       (((paused == 0 && (menuactive == MENU_Off)) && (ConsoleState - c_rising < 0xfffffffe)))) {
      if ((Button_Mlook.bDown != '\0') || (freelook.Value == true)) {
        iVar7 = (int)((float)ev->y * m_pitch.Value * mouse_sensitivity.Value * 16.0);
        iVar9 = -iVar7;
        if (invertmouse.Value == false) {
          iVar9 = iVar7;
        }
        G_AddViewPitch(iVar9);
        iVar9 = eventhead;
        events[eventhead].y = 0;
      }
      if ((Button_Strafe.bDown == '\0') && (lookstrafe.Value == false)) {
        G_AddViewAngle((int)((float)ev->x * m_yaw.Value * mouse_sensitivity.Value * 8.0));
        iVar9 = eventhead;
        events[eventhead].x = 0;
      }
      if (events[iVar9].y == 0 && events[iVar9].x == 0) {
        return;
      }
    }
    eventhead = iVar9 + 1U & 0x7f;
  }
  return;
}

Assistant:

void D_PostEvent (const event_t *ev)
{
	// Do not post duplicate consecutive EV_DeviceChange events.
	if (ev->type == EV_DeviceChange && events[eventhead].type == EV_DeviceChange)
	{
		return;
	}
	events[eventhead] = *ev;
	if (ev->type == EV_Mouse && !paused && menuactive == MENU_Off && ConsoleState != c_down && ConsoleState != c_falling
		)
	{
		if (Button_Mlook.bDown || freelook)
		{
			int look = int(ev->y * m_pitch * mouse_sensitivity * 16.0);
			if (invertmouse)
				look = -look;
			G_AddViewPitch (look);
			events[eventhead].y = 0;
		}
		if (!Button_Strafe.bDown && !lookstrafe)
		{
			G_AddViewAngle (int(ev->x * m_yaw * mouse_sensitivity * 8.0));
			events[eventhead].x = 0;
		}
		if ((events[eventhead].x | events[eventhead].y) == 0)
		{
			return;
		}
	}
	eventhead = (eventhead+1)&(MAXEVENTS-1);
}